

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

void __thiscall QListWidget::setCurrentRow(QListWidget *this,int row)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  QItemSelectionModel *pQVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  plVar3 = (long *)QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
  (**(code **)(*plVar3 + 0x60))(&local_48,plVar3,row,0);
  iVar1 = *(int *)(lVar2 + 0x338);
  pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  uVar6 = 0x12;
  if (iVar1 == 0) {
    uVar6 = 0;
  }
  uVar5 = 3;
  if (iVar1 != 1) {
    uVar5 = uVar6;
  }
  (**(code **)(*(long *)pQVar4 + 0x60))(pQVar4,&local_48,uVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidget::setCurrentRow(int row)
{
    Q_D(QListWidget);
    QModelIndex index = d->listModel()->index(row);
    if (d->selectionMode == SingleSelection)
        selectionModel()->setCurrentIndex(index, QItemSelectionModel::ClearAndSelect);
    else if (d->selectionMode == NoSelection)
        selectionModel()->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
    else
        selectionModel()->setCurrentIndex(index, QItemSelectionModel::SelectCurrent);
}